

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

bool __thiscall
Js::ProbeContainer::InitializeLocation
          (ProbeContainer *this,InterpreterHaltState *pHaltState,bool fMatchWithCurrentScriptContext
          )

{
  DiagStackFrame *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ReferencedArenaAdapter *pRVar4;
  StringBuilder<Memory::ArenaAllocator> *pSVar5;
  DiagStackFrame **ppDVar6;
  DebugManager *this_01;
  ArenaAllocator *alloc;
  
  this_01 = this->debugManager;
  if (this_01 == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0xc5,"(debugManager)","debugManager");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_01 = this->debugManager;
  }
  DebugManager::SetCurrentInterpreterLocation(this_01,pHaltState);
  pRVar4 = DebugManager::GetDiagnosticArena(this->debugManager);
  alloc = (ArenaAllocator *)0x0;
  if (pRVar4->deleteFlag == false) {
    alloc = pRVar4->arena;
  }
  UpdateFramePointers(this,fMatchWithCurrentScriptContext,0);
  pHaltState->framePointers = this->framePointers;
  pSVar5 = (StringBuilder<Memory::ArenaAllocator> *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e)
  ;
  pSVar5->alloc = alloc;
  pSVar5->firstChunk = (Data *)0x0;
  pSVar5->secondChunk = (Data *)0x0;
  pSVar5->appendPtr = (char16 *)0x0;
  pSVar5->length = 0;
  pSVar5->count = 0;
  pSVar5->initialSize = 0;
  pHaltState->stringBuilder = pSVar5;
  if (0 < (pHaltState->framePointers->list).
          super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.count) {
    ppDVar6 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
              Peek(pHaltState->framePointers,0);
    this_00 = *ppDVar6;
    pHaltState->topFrame = this_00;
    DiagStackFrame::SetIsTopFrame(this_00);
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::InitializeLocation (end): this=%p, pHaltState=%p, fMatch=%d, topFrame=%p\n"
                ,this,pHaltState,(ulong)fMatchWithCurrentScriptContext,pHaltState->topFrame);
  return true;
}

Assistant:

bool ProbeContainer::InitializeLocation(InterpreterHaltState* pHaltState, bool fMatchWithCurrentScriptContext)
    {
        Assert(debugManager);
        debugManager->SetCurrentInterpreterLocation(pHaltState);

        ArenaAllocator* pDiagArena = debugManager->GetDiagnosticArena()->Arena();

        UpdateFramePointers(fMatchWithCurrentScriptContext);
        pHaltState->framePointers = framePointers;
        pHaltState->stringBuilder = Anew(pDiagArena, StringBuilder<ArenaAllocator>, pDiagArena);

        if (pHaltState->framePointers->Count() > 0)
        {
            pHaltState->topFrame = pHaltState->framePointers->Peek(0);
            pHaltState->topFrame->SetIsTopFrame();
        }

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::InitializeLocation (end): this=%p, pHaltState=%p, fMatch=%d, topFrame=%p\n"),
            this, pHaltState, fMatchWithCurrentScriptContext, pHaltState->topFrame);

        return true;
    }